

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

pointer __thiscall
google::
dense_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
::alloc_impl<google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::
realloc_or_die(alloc_impl<google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
               *this,pointer ptr,size_type n)

{
  bool bVar1;
  pointer ppVar2;
  pointer extraout_RAX;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  size_type delta;
  
  ppVar2 = (pointer)realloc(ptr,n << 4);
  if (ppVar2 != (pointer)0x0) {
    return ppVar2;
  }
  dense_hashtable<std::pair<HashObject<8,8>*const,int>,HashObject<8,8>*,HashFn,google::dense_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::SelectKey,google::dense_hash_map<HashObject<8,8>*,int,HashFn,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::SetKey,std::equal_to<HashObject<8,8>*>,google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>
  ::alloc_impl<google::libc_allocator_with_realloc<std::pair<HashObject<8,8>*const,int>>>::
  realloc_or_die();
  if ((ptr == (pointer)0x0) ||
     (ppVar2 = extraout_RAX,
     (((dense_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
        *)n)->settings).super_sh_hashtable_settings<HashObject<8,_8>_*,_HashFn,_unsigned_long,_4>.
     consider_shrink_ != false)) {
    bVar1 = maybe_shrink((dense_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
                          *)n);
    ppVar2 = (pointer)CONCAT71(extraout_var,bVar1);
  }
  delta = (long)ptr -
          ((dense_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
            *)n)->num_elements;
  if ((pointer)((dense_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
                 *)n)->num_elements <= ptr && delta != 0) {
    bVar1 = resize_delta((dense_hashtable<std::pair<HashObject<8,_8>_*const,_int>,_HashObject<8,_8>_*,_HashFn,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<8,_8>_*,_int,_HashFn,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_*>,_google::libc_allocator_with_realloc<std::pair<HashObject<8,_8>_*const,_int>_>_>
                          *)n,delta);
    return (pointer)CONCAT71(extraout_var_00,bVar1);
  }
  return ppVar2;
}

Assistant:

pointer realloc_or_die(pointer ptr, size_type n) {
      pointer retval = this->reallocate(ptr, n);
      if (retval == NULL) {
        fprintf(stderr,
                "sparsehash: FATAL ERROR: failed to reallocate "
                "%lu elements for ptr %p",
                static_cast<unsigned long>(n), static_cast<void*>(ptr));
        exit(1);
      }
      return retval;
    }